

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O1

bool __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::ClassEscapePass0
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,Char *singleton,
          bool *previousSurrogatePart)

{
  EncodedChar *pEVar1;
  EncodedChar *pEVar2;
  Char *pCVar3;
  code *pcVar4;
  bool bVar5;
  EncodedChar EVar6;
  Char CVar7;
  int iVar8;
  undefined4 *puVar9;
  ulong uVar10;
  CharCount n;
  CharCount digits;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  
  if (this->inputLim < this->next) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar5) goto LAB_00ed1c08;
    *puVar9 = 0;
  }
  pEVar1 = this->next;
  EVar6 = *pEVar1;
  if (((ulong)(ushort)EVar6 == 0) && (this->inputLim <= pEVar1)) {
    Fail(this,-0x7ff5ec67);
    return false;
  }
  if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x20) != 0)) {
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar11 = 0;
    uVar12 = 0;
    while( true ) {
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ed1c08;
        *puVar9 = 0;
      }
      uVar10 = (ulong)(ushort)*this->next;
      uVar14 = 0;
      if (uVar10 < 0x100) {
        uVar14 = (uint)(byte)ASCIIChars::values[uVar10];
      }
      uVar14 = uVar12 * 8 + uVar14;
      if (uVar14 < 0x100) {
        if (this->inputLim < this->next + 1) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar9 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                             ,0xd3,"(next + n <= inputLim)","next + n <= inputLim");
          if (!bVar5) goto LAB_00ed1c08;
          *puVar9 = 0;
        }
        this->next = this->next + 1;
        uVar11 = uVar11 + 1;
        uVar12 = uVar14;
      }
      if ((0xff < uVar14) || (2 < uVar11)) break;
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ed1c08;
        *puVar9 = 0;
      }
      if ((0xff < (ulong)(ushort)*this->next) ||
         ((ASCIIChars::classes[(ushort)*this->next] & 0x20) == 0)) break;
    }
    *singleton = (Char)uVar12;
    this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
    goto LAB_00ed1a67;
  }
  pEVar2 = this->tempLocationOfSurrogatePair;
  this->tempLocationOfSurrogatePair = (EncodedChar *)0x0;
  if (this->inputLim <= pEVar1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar9 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x25d,"(!IsEOF())","!IsEOF()");
    if (!bVar5) goto LAB_00ed1c08;
    *puVar9 = 0;
  }
  pCVar3 = this->next;
  this->next = pCVar3 + 1;
  CVar7 = *pCVar3;
  if ((ulong)(ushort)CVar7 < 0x100) {
    bVar5 = (bool)((ASCIIChars::classes[(ushort)CVar7] & 2) >> 1);
  }
  else {
    bVar5 = (CVar7 & 0xfffeU) == 0x2028;
  }
  if (bVar5 != false) {
    Fail(this,-0x7ff5fc0c);
  }
  bVar5 = false;
  if (0x61 < (ushort)CVar7) {
    switch(CVar7) {
    case L'b':
      *singleton = L'\b';
      break;
    case L'c':
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) goto LAB_00ed1c08;
        *puVar9 = 0;
      }
      if ((0xff < (ulong)(ushort)*this->next) ||
         ((ASCIIChars::classes[(ushort)*this->next] & 8) == 0)) {
        DeferredFailIfUnicode(this,-0x7ff5e9d6);
      }
      if (this->inputLim < this->next) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar9 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar9 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
        if (!bVar5) {
LAB_00ed1c08:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar9 = 0;
      }
      if (((ulong)(ushort)*this->next < 0x100) &&
         ((ASCIIChars::classes[(ushort)*this->next] & 1) != 0)) {
        EVar6 = ECLookahead(this,0);
        CVar7 = Chars<char16_t>::UTC((ushort)EVar6 & 0x1f);
        *singleton = CVar7;
        n = 1;
LAB_00ed1a9c:
        ECConsume(this,n);
      }
      else {
        ECRevert(this,1);
        *singleton = L'\\';
      }
      break;
    case L'd':
    case L's':
    case L'w':
      goto switchD_00ed1636_caseD_64;
    case L'f':
      *singleton = L'\f';
      break;
    case L'n':
      *singleton = L'\n';
      break;
    case L'r':
      *singleton = L'\r';
      break;
    case L't':
      *singleton = L'\t';
      break;
    case L'u':
      this->tempLocationOfSurrogatePair = pEVar2;
      iVar8 = TryParseExtendedUnicodeEscape(this,singleton,previousSurrogatePart,true);
      if (0 < iVar8) {
        return true;
      }
      if (this->next + 4 <= this->inputLim) {
        EVar6 = ECLookahead(this,0);
        if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
          EVar6 = ECLookahead(this,1);
          if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
            EVar6 = ECLookahead(this,2);
            if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
              EVar6 = ECLookahead(this,3);
              if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
                uVar11 = 0;
                EVar6 = ECLookahead(this,0);
                uVar12 = 0;
                if ((ushort)EVar6 < 0x100) {
                  uVar12 = (uint)(byte)ASCIIChars::values[(ushort)EVar6] << 0xc;
                }
                EVar6 = ECLookahead(this,1);
                if ((ushort)EVar6 < 0x100) {
                  uVar11 = (uint)(byte)ASCIIChars::values[(ushort)EVar6] << 8;
                }
                EVar6 = ECLookahead(this,2);
                uVar13 = 0;
                uVar14 = 0;
                if ((ushort)EVar6 < 0x100) {
                  uVar14 = (uint)(byte)ASCIIChars::values[(ushort)EVar6] << 4;
                }
                EVar6 = ECLookahead(this,3);
                if ((ushort)EVar6 < 0x100) {
                  uVar13 = (uint)(byte)ASCIIChars::values[(ushort)EVar6];
                }
                CVar7 = Chars<char16_t>::UTC(uVar11 | uVar12 | uVar14 | uVar13);
                *singleton = CVar7;
                if (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true) {
                  TrackIfSurrogatePair(this,(uint)(ushort)CVar7,this->next + -1,5);
                }
                ECConsume(this,4);
                return true;
              }
            }
          }
        }
      }
      *singleton = CVar7;
      return true;
    case L'v':
      *singleton = L'\v';
      break;
    case L'x':
      if (this->next + 2 <= this->inputLim) {
        EVar6 = ECLookahead(this,0);
        if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
          EVar6 = ECLookahead(this,1);
          if (((ushort)EVar6 < 0x100) && ((ASCIIChars::classes[(ushort)EVar6] & 0x40) != 0)) {
            uVar12 = 0;
            EVar6 = ECLookahead(this,0);
            uVar11 = 0;
            if ((ushort)EVar6 < 0x100) {
              uVar11 = (uint)(byte)ASCIIChars::values[(ushort)EVar6] << 4;
            }
            EVar6 = ECLookahead(this,1);
            if ((ushort)EVar6 < 0x100) {
              uVar12 = (uint)(byte)ASCIIChars::values[(ushort)EVar6];
            }
            CVar7 = Chars<char16_t>::UTC(uVar12 | uVar11);
            *singleton = CVar7;
            n = 2;
            goto LAB_00ed1a9c;
          }
        }
      }
    default:
switchD_00ed1636_caseD_65:
      *singleton = CVar7;
    }
LAB_00ed1a67:
    bVar5 = true;
switchD_00ed1636_caseD_64:
    return bVar5;
  }
  if (CVar7 == L'D') {
    return false;
  }
  if (CVar7 == L'S') {
    return false;
  }
  if (CVar7 == L'W') {
    return false;
  }
  goto switchD_00ed1636_caseD_65;
}

Assistant:

bool Parser<P, IsLiteral>::ClassEscapePass0(Char& singleton, bool& previousSurrogatePart)
    {
        // Could be terminating 0
        EncodedChar ec = ECLookahead();
        if (ec == 0 && IsEOF())
        {
            Fail(JSERR_RegExpSyntax);
            return false;
        }
        else if (standardEncodedChars->IsOctal(ec))
        {
            uint n = 0;
            CharCount digits = 0;
            do
            {
                uint m = n * 8  + standardEncodedChars->DigitValue(ECLookahead());
                if (m > Chars<uint8>::MaxUChar) //Regex octal codes only support single byte (ASCII) characters.
                    break;
                n = m;
                ECConsume();
                digits++;
            }
            while (digits < 3 && standardEncodedChars->IsOctal(ECLookahead())); // terminating 0 is not octal
            singleton = UTC((UChar)n);
            // Clear possible pair
            this->tempLocationOfSurrogatePair = nullptr;
            return true;
        }
        else
        {
            const EncodedChar* location = this->tempLocationOfSurrogatePair;
            // Clear it for now, otherwise to many branches to clear it on.
            this->tempLocationOfSurrogatePair = nullptr;
            // An escaped '/' is ok
            Char c = NextChar();
            switch (c)
            {
            case 'b':
                singleton = '\b';
                return true;
            case 'f':
                singleton = '\f';
                return true;
            case 'n':
                singleton = '\n';
                return true;
            case 'r':
                singleton = '\r';
                return true;
            case 't':
                singleton = '\t';
                return true;
            case 'v':
                singleton = '\v';
                return true;
            case 'd':
            case 'D':
            case 's':
            case 'S':
            case 'w':
            case 'W':
                return false;
            case 'c':
                if (!standardEncodedChars->IsLetter(ECLookahead())) //Letter set [A-Z, a-z]
                {
                    // Fail in unicode mode for non-letter escaped control characters according to 262 Annex-B RegExp grammar spec #prod-annexB-Term 
                    DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                }

                if (standardEncodedChars->IsWord(ECLookahead())) // word set [A-Z,a-z,0-9,_], terminating 0 is not a word character
                {
                    singleton = UTC(Chars<EncodedChar>::CTU(ECLookahead()) % 32);
                    ECConsume();
                }
                else
                {
                    // If the lookahead is a non-alphanumeric and not an underscore ('_'), then treat '\' and 'c' separately.
                    //#sec-regular-expression-patterns-semantics 
                    ECRevert(1); //Put cursor back at 'c' and treat it as a non-escaped character.
                    singleton = '\\';
                }
                return true;
            case 'x':
                if (ECCanConsume(2) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(1))));
                    ECConsume(2);
                }
                else
                    singleton = c;
                return true;
            case 'u':
                this->tempLocationOfSurrogatePair = location;
                if (this->TryParseExtendedUnicodeEscape(singleton, previousSurrogatePart, true) > 0)
                    return true;
                else if (ECCanConsume(4) &&
                    standardEncodedChars->IsHex(ECLookahead(0)) &&
                    standardEncodedChars->IsHex(ECLookahead(1)) &&
                    standardEncodedChars->IsHex(ECLookahead(2)) &&
                    standardEncodedChars->IsHex(ECLookahead(3)))
                {
                    singleton = UTC((standardEncodedChars->DigitValue(ECLookahead(0)) << 12) |
                            (standardEncodedChars->DigitValue(ECLookahead(1)) << 8) |
                            (standardEncodedChars->DigitValue(ECLookahead(2)) << 4) |
                            (standardEncodedChars->DigitValue(ECLookahead(3))));
                    if (this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
                    {
                        // Current location
                        TrackIfSurrogatePair(singleton, (next - 1), 5);
                    }
                    // The above if statement, if true, will clear tempLocationOfSurrogatePair if needs to.
                    ECConsume(4);
                }
                else
                    singleton = c;
                return true;
            default:
                // embedded 0 is ok
                singleton = c;
                return true;
            }
        }
    }